

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.hpp
# Opt level: O0

void __thiscall
viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr
          (rt_expr<viennamath::rt_expression_interface<double>_> *this,
          rt_binary_expr<viennamath::rt_expression_interface<double>_> *other)

{
  int iVar1;
  undefined4 extraout_var;
  auto_ptr<viennamath::rt_expression_interface<double>_> local_28;
  rt_expression_interface<double> *local_20;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> *local_18;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> *other_local;
  rt_expr<viennamath::rt_expression_interface<double>_> *this_local;
  
  local_18 = other;
  other_local = (rt_binary_expr<viennamath::rt_expression_interface<double>_> *)this;
  std::auto_ptr<const_viennamath::rt_expression_interface<double>_>::auto_ptr
            (&this->rt_expr_,(element_type *)0x0);
  iVar1 = (*(local_18->super_rt_expression_interface<double>)._vptr_rt_expression_interface[2])();
  std::auto_ptr<viennamath::rt_expression_interface<double>_>::auto_ptr
            (&local_28,(element_type *)CONCAT44(extraout_var,iVar1));
  local_20 = (rt_expression_interface<double> *)
             std::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)&local_28);
  std::auto_ptr<const_viennamath::rt_expression_interface<double>_>::operator=
            (&this->rt_expr_,
             (auto_ptr_ref<const_viennamath::rt_expression_interface<double>_>)local_20);
  std::auto_ptr<viennamath::rt_expression_interface<double>_>::~auto_ptr(&local_28);
  return;
}

Assistant:

rt_expr(rt_binary_expr<InterfaceType> const & other)
      {
        rt_expr_ = std::auto_ptr<InterfaceType>(other.clone());
      }